

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl_engine.cpp
# Opt level: O2

void __thiscall
polyscope::render::backend_openGL3_glfw::GLEngine::updateWindowSize(GLEngine *this,bool force)

{
  undefined7 in_register_00000031;
  int newWindowHeight;
  int newBufferHeight;
  int newWindowWidth;
  int newBufferWidth;
  
  glfwGetFramebufferSize(this->mainWindow,&newBufferWidth,&newBufferHeight);
  glfwGetWindowSize(this->mainWindow,&newWindowWidth,&newWindowHeight);
  if (((((int)CONCAT71(in_register_00000031,force) != 0) || (newBufferWidth != view::bufferWidth))
      || (newBufferHeight != view::bufferHeight)) ||
     ((newWindowHeight != view::windowHeight || (newWindowWidth != view::windowWidth)))) {
    requestRedraw();
    if (newBufferHeight == 0) {
      newBufferHeight = 1;
    }
    if (newWindowHeight == 0) {
      newWindowHeight = 1;
    }
    view::bufferWidth = newBufferWidth;
    view::windowWidth = newWindowWidth;
    view::windowHeight = newWindowHeight;
    view::bufferHeight = newBufferHeight;
    (**(code **)(*render::engine + 0x38))();
    (**(code **)(*render::engine + 0x40))();
  }
  return;
}

Assistant:

void GLEngine::updateWindowSize(bool force) {
  int newBufferWidth, newBufferHeight, newWindowWidth, newWindowHeight;
  glfwGetFramebufferSize(mainWindow, &newBufferWidth, &newBufferHeight);
  glfwGetWindowSize(mainWindow, &newWindowWidth, &newWindowHeight);
  if (force || newBufferWidth != view::bufferWidth || newBufferHeight != view::bufferHeight ||
      newWindowHeight != view::windowHeight || newWindowWidth != view::windowWidth) {
    // Basically a resize callback
    requestRedraw();

    // prevent any division by zero for e.g. aspect ratio calcs
    if (newBufferHeight == 0) newBufferHeight = 1;
    if (newWindowHeight == 0) newWindowHeight = 1;

    view::bufferWidth = newBufferWidth;
    view::bufferHeight = newBufferHeight;
    view::windowWidth = newWindowWidth;
    view::windowHeight = newWindowHeight;

    render::engine->resizeScreenBuffers();
    render::engine->setScreenBufferViewports();
  }
}